

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O2

shared_ptr<mcc::DeclList> __thiscall mcc::Parser::DeclarationList(Parser *this)

{
  shared_ptr<mcc::Expr> *psVar1;
  bool bVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TokenType type_00;
  Parser *in_RSI;
  shared_ptr<mcc::DeclList> sVar3;
  bool local_f2 [2];
  undefined1 local_f0 [8];
  shared_ptr<mcc::Token> len;
  shared_ptr<mcc::Expr> init;
  vector<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_>
  var_decl_list;
  shared_ptr<mcc::Token> name;
  shared_ptr<mcc::Token> token;
  Type type;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  var_decl_list.
  super__Vector_base<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  var_decl_list.
  super__Vector_base<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  var_decl_list.
  super__Vector_base<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>,
             &(in_RSI->token_).super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>);
  ParsePrim(&type,in_RSI);
  do {
    ParsePtr(in_RSI,&type);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&init,"Expected identifier after type declaration",(allocator<char> *)&len)
    ;
    type_00 = (TokenType)in_RSI;
    Consume((Parser *)&name,type_00,(string *)0x30);
    std::__cxx11::string::~string((string *)&init);
    bVar2 = Match(in_RSI,T_LBRACKET);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init,"Expected integer length > 0",(allocator<char> *)local_f0);
      Consume((Parser *)&len,type_00,(string *)0x2e);
      std::__cxx11::string::~string((string *)&init);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&init,"Expected \']\' after array length declaration",
                 (allocator<char> *)local_f0);
      Consume((Parser *)(local_48 + 1),type_00,(string *)0xc);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
      std::__cxx11::string::~string((string *)&init);
      type.len = (len.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->int_value_
      ;
      local_f0 = (undefined1  [8])0x0;
      local_f2[0] = false;
      local_f2[1] = true;
      std::
      make_shared<mcc::VarDecl,std::shared_ptr<mcc::Token>&,decltype(nullptr),mcc::Type&,bool,bool>
                ((shared_ptr<mcc::Token> *)&init,(void **)&name,(Type *)local_f0,(bool *)&type,
                 local_f2);
      std::vector<std::shared_ptr<mcc::VarDecl>,std::allocator<std::shared_ptr<mcc::VarDecl>>>::
      emplace_back<std::shared_ptr<mcc::VarDecl>>
                ((vector<std::shared_ptr<mcc::VarDecl>,std::allocator<std::shared_ptr<mcc::VarDecl>>>
                  *)&var_decl_list,(shared_ptr<mcc::VarDecl> *)&init);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&init.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      type.len = 0;
      psVar1 = (shared_ptr<mcc::Expr> *)&len;
    }
    else {
      OptionalExpression((Parser *)&init,type_00);
      local_f0 = (undefined1  [8])((ulong)local_f0 & 0xffffffffffffff00);
      local_f2[0] = true;
      std::
      make_shared<mcc::VarDecl,std::shared_ptr<mcc::Token>&,std::shared_ptr<mcc::Expr>&,mcc::Type&,bool,bool>
                (&len,(shared_ptr<mcc::Expr> *)&name,(Type *)&init,(bool *)&type,(bool *)local_f0);
      std::vector<std::shared_ptr<mcc::VarDecl>,std::allocator<std::shared_ptr<mcc::VarDecl>>>::
      emplace_back<std::shared_ptr<mcc::VarDecl>>
                ((vector<std::shared_ptr<mcc::VarDecl>,std::allocator<std::shared_ptr<mcc::VarDecl>>>
                  *)&var_decl_list,(shared_ptr<mcc::VarDecl> *)&len);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&len.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      psVar1 = &init;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&(psVar1->super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&name.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    bVar2 = Match(in_RSI,T_COMMA);
  } while (bVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&init,"Expected \';\' after variable declaration",(allocator<char> *)&name);
  Consume((Parser *)&stack0xffffffffffffffb0,type_00,(string *)0x6);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_48);
  std::__cxx11::string::~string((string *)&init);
  std::
  make_shared<mcc::DeclList,std::shared_ptr<mcc::Token>,std::vector<std::shared_ptr<mcc::VarDecl>,std::allocator<std::shared_ptr<mcc::VarDecl>>>&>
            ((shared_ptr<mcc::Token> *)this,
             (vector<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_>
              *)&token);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&type.name.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::vector<std::shared_ptr<mcc::VarDecl>,_std::allocator<std::shared_ptr<mcc::VarDecl>_>_>::
  ~vector(&var_decl_list);
  sVar3.super___shared_ptr<mcc::DeclList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<mcc::DeclList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<mcc::DeclList>)
         sVar3.super___shared_ptr<mcc::DeclList,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<DeclList> Parser::DeclarationList() {
  std::vector<std::shared_ptr<VarDecl>> var_decl_list;
  std::shared_ptr<Token> token = Peek();
  Type type = ParsePrim();

  do {
    ParsePtr(type);
    std::shared_ptr<Token> name = Consume(TokenType::T_IDENTIFIER,"Expected identifier after type declaration");
    if (Match(TokenType::T_LBRACKET)) {
      std::shared_ptr<Token> len = Consume(TokenType::T_INT_LIT, "Expected integer length > 0");
      Consume(TokenType::T_RBRACKET, "Expected ']' after array length declaration");
      type.len = len->Int();
      var_decl_list.push_back(std::make_shared<VarDecl>(name, nullptr, type, false, true));
      type.len = 0;
    } else {
      std::shared_ptr<Expr> init = OptionalExpression(0);
      var_decl_list.push_back(std::make_shared<VarDecl>(name, init, type, false, true));
    }
  } while (Match(TokenType::T_COMMA));

  Consume(TokenType::T_SEMICOLON, "Expected ';' after variable declaration");
  return std::make_shared<DeclList>(std::move(token), var_decl_list);
}